

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O0

void BrotliCreateHuffmanTree
               (uint32_t *data,size_t length,int tree_limit,HuffmanTree *tree,uint8_t *depth)

{
  HuffmanTree HVar1;
  int iVar2;
  long lVar3;
  HuffmanTree *pHVar4;
  bool bVar5;
  uint local_10c;
  size_t j_end;
  size_t right;
  size_t left;
  size_t sStack_e8;
  uint32_t count;
  size_t k;
  size_t j;
  size_t i;
  size_t n;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  HuffmanTree sentinel;
  uint32_t count_limit;
  uint8_t *depth_local;
  HuffmanTree *tree_local;
  int tree_limit_local;
  size_t length_local;
  uint32_t *data_local;
  HuffmanTree local_68;
  HuffmanTree tmp_1;
  size_t j_2;
  size_t i_2;
  size_t gap;
  HuffmanTree HStack_40;
  int g;
  size_t j_1;
  size_t k_1;
  HuffmanTree tmp;
  size_t i_1;
  
  n._4_4_ = 0xffffffff;
  uStack_c0 = 0xffff;
  uStack_be = 0xffff;
  sentinel.total_count_ = 1;
  do {
    i = 0;
    j = length;
    while (j != 0) {
      j = j - 1;
      if (data[j] != 0) {
        local_10c = data[j];
        if (local_10c <= sentinel.total_count_) {
          local_10c = sentinel.total_count_;
        }
        pHVar4 = tree + i;
        pHVar4->total_count_ = local_10c;
        pHVar4->index_left_ = -1;
        pHVar4->index_right_or_value_ = (int16_t)j;
        i = i + 1;
      }
    }
    if (i == 1) {
      depth[tree->index_right_or_value_] = '\x01';
      return;
    }
    if (i < 0xd) {
      tmp.total_count_ = 1;
      tmp.index_left_ = 0;
      tmp.index_right_or_value_ = 0;
      for (; (ulong)tmp < i; tmp = (HuffmanTree)((long)tmp + 1)) {
        k_1 = *(size_t *)(tree + (long)tmp);
        j_1 = (size_t)tmp;
        do {
          HStack_40 = (HuffmanTree)(j_1 - 1);
          iVar2 = SortHuffmanTree((HuffmanTree *)&k_1,tree + (long)HStack_40);
          if (iVar2 == 0) break;
          tree[j_1] = tree[(long)HStack_40];
          j_1 = (size_t)HStack_40;
        } while (HStack_40 != (HuffmanTree)0x0);
        pHVar4 = tree + j_1;
        pHVar4->total_count_ = (undefined4)k_1;
        pHVar4->index_left_ = k_1._4_2_;
        pHVar4->index_right_or_value_ = k_1._6_2_;
      }
    }
    else {
      gap._4_4_ = 0;
      if (i < 0x39) {
        gap._4_4_ = 2;
      }
      for (; gap._4_4_ < 6; gap._4_4_ = gap._4_4_ + 1) {
        HVar1 = *(HuffmanTree *)(SortHuffmanTreeItems_gaps + (long)gap._4_4_ * 8);
        for (j_2 = (size_t)HVar1; j_2 < i; j_2 = j_2 + 1) {
          tmp_1.total_count_ = (undefined4)j_2;
          tmp_1.index_left_ = j_2._4_2_;
          tmp_1.index_right_or_value_ = j_2._6_2_;
          local_68 = tree[j_2];
          while( true ) {
            bVar5 = false;
            if ((ulong)HVar1 <= (ulong)tmp_1) {
              iVar2 = SortHuffmanTree(&local_68,tree + ((long)tmp_1 - (long)HVar1));
              bVar5 = iVar2 != 0;
            }
            if (!bVar5) break;
            tree[(long)tmp_1] = tree[(long)tmp_1 - (long)HVar1];
            tmp_1 = (HuffmanTree)((long)tmp_1 - (long)HVar1);
          }
          tree[(long)tmp_1] = local_68;
        }
      }
    }
    tree[i] = unique0x100002a7;
    tree[i + 1] = unique0x100002a7;
    j = 0;
    k = i + 1;
    sStack_e8 = i;
    while (sStack_e8 = sStack_e8 - 1, sStack_e8 != 0) {
      if (tree[k].total_count_ < tree[j].total_count_) {
        right = k;
        k = k + 1;
      }
      else {
        right = j;
        j = j + 1;
      }
      if (tree[k].total_count_ < tree[j].total_count_) {
        j_end = k;
        k = k + 1;
      }
      else {
        j_end = j;
        j = j + 1;
      }
      lVar3 = i * 2 - sStack_e8;
      tree[lVar3].total_count_ = tree[right].total_count_ + tree[j_end].total_count_;
      tree[lVar3].index_left_ = (int16_t)right;
      tree[lVar3].index_right_or_value_ = (int16_t)j_end;
      tree[lVar3 + 1] = unique0x100002a7;
    }
    iVar2 = BrotliSetDepth((int)i * 2 + -1,tree,depth,tree_limit);
    if (iVar2 != 0) {
      return;
    }
    sentinel.total_count_ = sentinel.total_count_ << 1;
  } while( true );
}

Assistant:

void BrotliCreateHuffmanTree(const uint32_t* data,
                             const size_t length,
                             const int tree_limit,
                             HuffmanTree* tree,
                             uint8_t* depth) {
  uint32_t count_limit;
  HuffmanTree sentinel;
  InitHuffmanTree(&sentinel, BROTLI_UINT32_MAX, -1, -1);
  /* For block sizes below 64 kB, we never need to do a second iteration
     of this loop. Probably all of our block sizes will be smaller than
     that, so this loop is mostly of academic interest. If we actually
     would need this, we would be better off with the Katajainen algorithm. */
  for (count_limit = 1; ; count_limit *= 2) {
    size_t n = 0;
    size_t i;
    size_t j;
    size_t k;
    for (i = length; i != 0;) {
      --i;
      if (data[i]) {
        const uint32_t count = BROTLI_MAX(uint32_t, data[i], count_limit);
        InitHuffmanTree(&tree[n++], count, -1, (int16_t)i);
      }
    }

    if (n == 1) {
      depth[tree[0].index_right_or_value_] = 1;  /* Only one element. */
      break;
    }

    SortHuffmanTreeItems(tree, n, SortHuffmanTree);

    /* The nodes are:
       [0, n): the sorted leaf nodes that we start with.
       [n]: we add a sentinel here.
       [n + 1, 2n): new parent nodes are added here, starting from
                    (n+1). These are naturally in ascending order.
       [2n]: we add a sentinel at the end as well.
       There will be (2n+1) elements at the end. */
    tree[n] = sentinel;
    tree[n + 1] = sentinel;

    i = 0;      /* Points to the next leaf node. */
    j = n + 1;  /* Points to the next non-leaf node. */
    for (k = n - 1; k != 0; --k) {
      size_t left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }

      {
        /* The sentinel node becomes the parent node. */
        size_t j_end = 2 * n - k;
        tree[j_end].total_count_ =
            tree[left].total_count_ + tree[right].total_count_;
        tree[j_end].index_left_ = (int16_t)left;
        tree[j_end].index_right_or_value_ = (int16_t)right;

        /* Add back the last sentinel node. */
        tree[j_end + 1] = sentinel;
      }
    }
    if (BrotliSetDepth((int)(2 * n - 1), &tree[0], depth, tree_limit)) {
      /* We need to pack the Huffman tree in tree_limit bits. If this was not
         successful, add fake entities to the lowest values and retry. */
      break;
    }
  }
}